

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# walltime.cc
# Opt level: O2

WallTime benchmark::walltime::Now(void)

{
  double dVar1;
  double dVar2;
  ulong uVar3;
  WallTime WVar4;
  bool bVar5;
  int iVar6;
  undefined8 in_RAX;
  undefined4 extraout_var;
  long lVar7;
  undefined8 uVar8;
  ostream *poVar9;
  ulong uVar10;
  double *pdVar11;
  double dVar12;
  undefined4 extraout_var_00;
  ulong uVar13;
  char *pcVar14;
  WallTimeImp *in_RDI;
  WallTimeImp *this;
  CheckHandler local_28;
  
  uVar8 = CONCAT71((int7)((ulong)in_RAX >> 8),Now()::useCPUClock);
  if (Now()::useCPUClock == '\0') {
    in_RDI = (WallTimeImp *)&Now()::useCPUClock;
    uVar8 = __cxa_guard_acquire();
    if ((int)uVar8 != 0) {
      bVar5 = CpuScalingEnabled();
      poVar9 = internal::GetLogInstanceForLevel(1);
      poVar9 = std::operator<<(poVar9,"-- LOG(");
      poVar9 = (ostream *)std::ostream::operator<<(poVar9,1);
      poVar9 = std::operator<<(poVar9,"): ");
      pcVar14 = "Using the CPU cycle clock to provide walltime::Now().\n";
      if (bVar5) {
        pcVar14 = "Using std::chrono to provide walltime::Now().\n";
      }
      std::operator<<(poVar9,pcVar14);
      Now::useCPUClock = !bVar5;
      in_RDI = (WallTimeImp *)&Now()::useCPUClock;
      uVar8 = __cxa_guard_release();
    }
  }
  if (Now::useCPUClock == true) {
    uVar10 = CONCAT71((int7)((ulong)uVar8 >> 8),(anonymous_namespace)::CPUWalltimeNow()::imp);
    pdVar11 = (anonymous_namespace)::CPUWalltimeNow()::imp;
    if ((anonymous_namespace)::CPUWalltimeNow()::imp == '\0') {
      in_RDI = (WallTimeImp *)&(anonymous_namespace)::CPUWalltimeNow()::imp;
      uVar10 = __cxa_guard_acquire();
      pdVar11 = (anonymous_namespace)::CPUWalltimeNow()::imp;
      if ((int)uVar10 != 0) {
        if (((anonymous_namespace)::WallTimeImp::GetWallTimeImp()::imp == '\0') &&
           (iVar6 = __cxa_guard_acquire(&(anonymous_namespace)::WallTimeImp::GetWallTimeImp()::imp),
           iVar6 != 0)) {
          this = (WallTimeImp *)0x30;
          pdVar11 = (double *)operator_new(0x30);
          pdVar11[4] = 0.0;
          pdVar11[5] = 0.0;
          pdVar11[2] = 0.0;
          pdVar11[3] = 0.0;
          *pdVar11 = 0.0;
          pdVar11[1] = 0.0;
          dVar12 = CyclesPerSecond();
          pdVar11[2] = (double)(long)dVar12;
          if ((double)(long)dVar12 == 0.0) {
            internal::CheckHandler::CheckHandler
                      (&local_28,"cycles_per_second_ != 0",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/reBass[P]libbeatnik/external/reLib/tests/external/benchmark/src/walltime.cc"
                       ,"WallTimeImp",0xa6);
            internal::CheckHandler::~CheckHandler(&local_28);
          }
          internal::GetNullLogInstance();
          pdVar11[3] = 1.0 / (double)(long)pdVar11[2];
          dVar12 = (double)(long)((double)(long)pdVar11[2] * 0.0001);
          pdVar11[5] = dVar12;
          do {
            uVar10 = rdtsc();
            pdVar11[1] = (double)(uVar10 & 0xffffffff00000000 |
                                 CONCAT44((int)((ulong)dVar12 >> 0x20),(int)uVar10));
            WVar4 = anon_unknown_1::WallTimeImp::Slow(this);
            *pdVar11 = WVar4;
            uVar10 = rdtsc();
            dVar12 = pdVar11[1];
          } while ((long)pdVar11[5] <
                   (long)((uVar10 & 0xffffffff00000000 | CONCAT44(extraout_var_00,(int)uVar10)) -
                         (long)dVar12));
          LOCK();
          *(undefined4 *)((long)pdVar11 + 0x24) = 0;
          UNLOCK();
          *(int *)(pdVar11 + 4) = (int)((ulong)dVar12 >> 0x20);
          (anonymous_namespace)::WallTimeImp::GetWallTimeImp()::imp = pdVar11;
          __cxa_guard_release(&(anonymous_namespace)::WallTimeImp::GetWallTimeImp()::imp);
        }
        (anonymous_namespace)::CPUWalltimeNow()::imp =
             (anonymous_namespace)::WallTimeImp::GetWallTimeImp()::imp;
        in_RDI = (WallTimeImp *)&(anonymous_namespace)::CPUWalltimeNow()::imp;
        uVar10 = __cxa_guard_release();
        pdVar11 = (anonymous_namespace)::CPUWalltimeNow()::imp;
      }
    }
    do {
      uVar13 = rdtsc();
      uVar13 = uVar13 & 0xffffffff00000000 | CONCAT44((int)(uVar10 >> 0x20),(int)uVar13);
      dVar2 = pdVar11[1];
      dVar12 = *pdVar11;
      dVar1 = pdVar11[3];
      iVar6 = (int)(uVar13 >> 0x20);
      if (*(int *)(pdVar11 + 4) == iVar6) {
        return (double)*(float *)((long)pdVar11 + 0x24) +
               (double)(long)(uVar13 - (long)dVar2) * dVar1 + dVar12;
      }
      WVar4 = anon_unknown_1::WallTimeImp::Slow(in_RDI);
      uVar3 = rdtsc();
      uVar10 = CONCAT44(extraout_var,(int)uVar3);
    } while ((long)pdVar11[5] < (long)((uVar3 & 0xffffffff00000000 | uVar10) - uVar13));
    LOCK();
    *(float *)((long)pdVar11 + 0x24) =
         (float)(WVar4 - ((double)(long)(uVar13 - (long)dVar2) * dVar1 + dVar12));
    UNLOCK();
    *(int *)(pdVar11 + 4) = iVar6;
  }
  else {
    lVar7 = std::chrono::_V2::steady_clock::now();
    WVar4 = (double)lVar7 / 1000000000.0;
  }
  return WVar4;
}

Assistant:

WallTime Now()
{
  static bool useCPUClock = UseCpuCycleClock();
  if (useCPUClock) {
    return CPUWalltimeNow();
  } else {
    return ChronoWalltimeNow();
  }
}